

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

string * __thiscall calculator::Word::lexeme_abi_cxx11_(string *__return_storage_ptr__,Word *this)

{
  Word *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->__lexeme);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string lexeme() { return __lexeme; }